

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Exec
          (SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *this,
          Matcher *matcher,Char *input,CharCount inputLength,CharCount *matchStart,
          CharCount *inputOffset,CharCount *nextSyncInputOffset,uint8 **instPointer,
          ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  CharCount CVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Program *pPVar5;
  uint uVar6;
  Type patLen;
  
  uVar6 = (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.offset;
  patLen = (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.length;
  pPVar5 = (matcher->program).ptr;
  if ((pPVar5->rep).insts.litbufLen - uVar6 < patLen * 4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x2ae,
                       "(length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset)"
                       ,
                       "length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pPVar5 = (matcher->program).ptr;
    uVar6 = (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.offset;
    patLen = (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.length;
  }
  bVar3 = TextbookBoyerMoore<char16_t>::Match<4u,1u>
                    (&(this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner,input,
                     inputLength,inputOffset,(pPVar5->rep).insts.litbuf.ptr + uVar6,patLen,
                     matcher->stats);
  if (bVar3) {
    CVar1 = *inputOffset;
    *matchStart = CVar1;
    *inputOffset = CVar1 + (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.
                           super_LiteralMixin.length;
    *instPointer = *instPointer + 0x449;
  }
  else {
    *matchStart = inputLength;
  }
  return !bVar3;
}

Assistant:

inline bool SyncToLiteralAndConsumeInstT<ScannerT>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (!this->Match(matcher, input, inputLength, inputOffset))
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        matchStart = inputOffset;
        inputOffset += ScannerT::GetLiteralLength();
        instPointer += sizeof(*this);
        return false;
    }